

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

void tinyfd_beep(void)

{
  int iVar1;
  FILE *__stream;
  FILE *lIn;
  char lDialogString [256];
  char local_108 [264];
  
  iVar1 = osascriptPresent();
  if (iVar1 == 0) {
    iVar1 = pactlPresent();
    if (iVar1 == 0) {
      iVar1 = speakertestPresent();
      if (iVar1 == 0) {
        iVar1 = beepexePresent();
        if (iVar1 == 0) {
          iVar1 = playPresent();
          if (iVar1 == 0) {
            iVar1 = beepPresent();
            if (iVar1 == 0) {
              strcpy(local_108,"printf \'\a\' > /dev/tty");
            }
            else {
              strcpy(local_108,"beep -f 440 -l 300");
            }
          }
          else {
            strcpy(local_108,"play -q -n synth .3 sine 440");
          }
        }
        else {
          strcpy(local_108,"beep.exe 440 300");
        }
      }
      else {
        strcpy(local_108,"( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .5; kill -9 $pid"
              );
      }
    }
    else {
      signal(2,sigHandler);
      strcpy(local_108,
             "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum"
            );
    }
  }
  else {
    iVar1 = afplayPresent();
    if (iVar1 < 2) {
      strcpy(local_108,"osascript -e \'tell application \"System Events\" to beep\'");
    }
    else {
      strcpy(local_108,"afplay /System/Library/Sounds/Ping.aiff");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",local_108);
  }
  __stream = popen(local_108,"r");
  if (__stream != (FILE *)0x0) {
    pclose(__stream);
  }
  iVar1 = pactlPresent();
  if (iVar1 != 0) {
    signal(2,(__sighandler_t)0x0);
  }
  return;
}

Assistant:

void tinyfd_beep(void)
{
        char lDialogString[256] ;
        FILE * lIn ;

        if ( osascriptPresent() )
        {
                if ( afplayPresent() >= 2 )
                {
                        strcpy( lDialogString , "afplay /System/Library/Sounds/Ping.aiff") ;
                }
                else
                {
                        strcpy( lDialogString , "osascript -e 'tell application \"System Events\" to beep'") ;
                }
        }
        else if ( pactlPresent() )
        {
                signal(SIGINT, sigHandler);
                /*strcpy( lDialogString , "pactl load-module module-sine frequency=440;sleep .3;pactl unload-module module-sine" ) ;*/
                strcpy( lDialogString , "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum" ) ;
        }
        else if ( speakertestPresent() )
        {
                /*strcpy( lDialogString , "timeout -k .3 .3 speaker-test --frequency 440 --test sine > /dev/tty" ) ;*/
                strcpy( lDialogString , "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .5; kill -9 $pid" ) ; /*.3 was too short for mac g3*/
        }
        else if (beepexePresent())
        {
                strcpy(lDialogString, "beep.exe 440 300");
        }
        else if (playPresent()) /* play is part of sox */
        {
                strcpy(lDialogString, "play -q -n synth .3 sine 440");
        }
        else if ( beepPresent() )
        {
                strcpy( lDialogString , "beep -f 440 -l 300" ) ;
        }
        else
        {
                strcpy( lDialogString , "printf '\a' > /dev/tty" ) ;
        }

        if (tinyfd_verbose) printf( "lDialogString: %s\n" , lDialogString ) ;

        if ( ( lIn = popen( lDialogString , "r" ) ) )
        {
                pclose( lIn ) ;
        }

        if ( pactlPresent() )
        {
                signal(SIGINT, SIG_DFL);
        }
}